

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O2

TSSymbol ts_language_symbol_for_name(TSLanguage *self,char *name)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  TSSymbol i;
  ushort uVar4;
  TSSymbol TVar5;
  
  iVar3 = strcmp(name,"ERROR");
  if (iVar3 == 0) {
    TVar5 = 0xffff;
  }
  else {
    uVar1 = self->alias_count;
    uVar2 = self->symbol_count;
    for (uVar4 = 0; (uint)uVar4 < uVar1 + uVar2; uVar4 = uVar4 + 1) {
      iVar3 = strcmp(self->symbol_names[uVar4],name);
      if (iVar3 == 0) {
        return uVar4;
      }
    }
    TVar5 = 0;
  }
  return TVar5;
}

Assistant:

TSSymbol ts_language_symbol_for_name(const TSLanguage *self, const char *name) {
  if (!strcmp(name, "ERROR")) return ts_builtin_sym_error;

  uint32_t count = ts_language_symbol_count(self);
  for (TSSymbol i = 0; i < count; i++) {
    if (!strcmp(self->symbol_names[i], name)) {
      return i;
    }
  }
  return 0;
}